

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O0

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar11;
  int j;
  float *sptr;
  int i;
  float *outptr;
  int p;
  int sw;
  int sh;
  Mat m;
  int q;
  int outc;
  int outh;
  int outw;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_1;
  Mat *m_2;
  Allocator *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  Mat *in_stack_fffffffffffffd10;
  int local_2bc;
  undefined4 *local_2b8;
  int local_2b0;
  undefined4 *local_258;
  int local_24c;
  int local_248;
  int local_244;
  int local_1f8;
  int local_1ac;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar9 = in_RSI[6];
  lVar10 = in_RSI[7];
  iVar2 = *(int *)(in_RDI + 0xd0);
  iVar3 = *(int *)(in_RDI + 0xd0);
  Mat::create(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
              (int)in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
              in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  bVar11 = true;
  if (*in_RDX != 0) {
    bVar11 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
  }
  if (bVar11) {
    local_1ac = -100;
  }
  else {
    for (local_1f8 = 0; local_1f8 < (int)lVar10; local_1f8 = local_1f8 + 1) {
      iVar4 = *(int *)((long)in_RSI + 0x2c);
      lVar5 = *in_RSI;
      lVar6 = in_RSI[8];
      lVar7 = in_RSI[2];
      lVar8 = in_RSI[2];
      for (local_244 = 0; local_244 < *(int *)(in_RDI + 0xd0); local_244 = local_244 + 1) {
        for (local_248 = 0; local_248 < *(int *)(in_RDI + 0xd0); local_248 = local_248 + 1) {
          if (*(int *)(in_RDI + 0xd4) == 0) {
            local_24c = local_1f8 * *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd0) +
                        local_244 * *(int *)(in_RDI + 0xd0) + local_248;
          }
          else {
            local_24c = (local_244 * *(int *)(in_RDI + 0xd0) + local_248) * (int)lVar10 + local_1f8;
          }
          local_258 = (undefined4 *)(*in_RDX + in_RDX[8] * (long)local_24c * in_RDX[2]);
          for (local_2b0 = 0; local_2b0 < (int)lVar9 / iVar3; local_2b0 = local_2b0 + 1) {
            local_2b8 = (undefined4 *)
                        (lVar5 + lVar6 * local_1f8 * lVar7 +
                         (long)iVar4 * (long)(local_2b0 * *(int *)(in_RDI + 0xd0) + local_244) *
                         lVar8 + (long)local_248 * 4);
            for (local_2bc = 0; local_2bc < iVar1 / iVar2; local_2bc = local_2bc + 1) {
              *local_258 = *local_2b8;
              local_2b8 = local_2b8 + *(int *)(in_RDI + 0xd0);
              local_258 = local_258 + 1;
            }
          }
        }
      }
    }
    local_1ac = 0;
  }
  return local_1ac;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}